

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_WriteArrayBuffer(BCWriterState *s,JSValue obj)

{
  long in_RSI;
  JSArrayBuffer *abuf;
  JSObject *p;
  undefined4 in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffc0 [16];
  undefined4 local_4;
  
  if (*(char *)(*(long *)(in_RSI + 0x30) + 4) == '\0') {
    bc_put_u8(in_stack_ffffffffffffffc0._0_8_,(uint8_t)(in_stack_ffffffffffffffbc >> 0x18));
    bc_put_leb128(in_stack_ffffffffffffffc0._0_8_,in_stack_ffffffffffffffbc);
    dbuf_put(in_stack_ffffffffffffffc0._8_8_,in_stack_ffffffffffffffc0._0_8_,
             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    local_4 = 0;
  }
  else {
    JS_ThrowTypeErrorDetachedArrayBuffer((JSContext *)0x16aec3);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int JS_WriteArrayBuffer(BCWriterState *s, JSValueConst obj)
{
    JSObject *p = JS_VALUE_GET_OBJ(obj);
    JSArrayBuffer *abuf = p->u.array_buffer;
    if (abuf->detached) {
        JS_ThrowTypeErrorDetachedArrayBuffer(s->ctx);
        return -1;
    }
    bc_put_u8(s, BC_TAG_ARRAY_BUFFER);
    bc_put_leb128(s, abuf->byte_length);
    dbuf_put(&s->dbuf, abuf->data, abuf->byte_length);
    return 0;
}